

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

size_t nh_base64_encode(uchar *src,size_t src_len,uchar *dest)

{
  uchar *puVar1;
  uchar *puVar2;
  uchar *local_48;
  uchar *pos;
  uchar *in;
  uchar *end;
  size_t olen;
  uchar *dest_local;
  size_t src_len_local;
  uchar *src_local;
  
  if ((src_len << 2) / 3 + 5 < src_len) {
    src_local = (uchar *)0x0;
  }
  else {
    puVar1 = src + src_len;
    local_48 = dest;
    for (pos = src; puVar2 = local_48, 2 < (long)puVar1 - (long)pos; pos = pos + 3) {
      *local_48 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(uint)*pos >> 2];
      local_48[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((*pos & 3) << 4 | (int)(uint)pos[1] >> 4)];
      puVar2 = local_48 + 3;
      local_48[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                    [(int)((pos[1] & 0xf) << 2 | (int)(uint)pos[2] >> 6)];
      local_48 = local_48 + 4;
      *puVar2 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                [(int)(pos[2] & 0x3f)];
    }
    if (puVar1 != pos) {
      *local_48 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                  [(int)(uint)*pos >> 2];
      if ((long)puVar1 - (long)pos == 1) {
        local_48[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)((*pos & 3) << 4)];
        local_48[2] = '=';
      }
      else {
        local_48[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)((*pos & 3) << 4 | (int)(uint)pos[1] >> 4)];
        local_48[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                      [(int)((pos[1] & 0xf) << 2)];
      }
      local_48 = local_48 + 3;
      *local_48 = '=';
      local_48 = puVar2 + 4;
    }
    *local_48 = '\0';
    src_local = local_48 + -(long)dest;
  }
  return (size_t)src_local;
}

Assistant:

size_t nh_base64_encode(const unsigned char *src, size_t src_len, unsigned char *dest) {
    // modified from http://web.mit.edu/freebsd/head/contrib/wpa/src/utils/base64.c
    size_t olen = src_len * 4 / 3 + 4; /* 3-byte blocks to 4-byte */
    olen++; /* nul termination */
    if (olen < src_len) return 0;

    unsigned char const *end = src + src_len;
    unsigned char const *in = src;
    unsigned char *pos = dest;
    while (end - in >= 3) {
        *pos++ = nh_base64_table[in[0] >> 2];
        *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
        *pos++ = nh_base64_table[((in[1] & 0x0f) << 2) | (in[2] >> 6)];
        *pos++ = nh_base64_table[in[2] & 0x3f];
        in += 3;
    }

    if (end - in) {
        *pos++ = nh_base64_table[in[0] >> 2];
        if (end - in == 1) {
            *pos++ = nh_base64_table[(in[0] & 0x03) << 4];
            *pos++ = '=';
        } else {
            *pos++ = nh_base64_table[((in[0] & 0x03) << 4) | (in[1] >> 4)];
            *pos++ = nh_base64_table[(in[1] & 0x0f) << 2];
        }
        *pos++ = '=';
    }

    *pos = '\0';
    return pos - dest;
}